

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O0

void Gia_ManMultiReport(Aig_Man_t *p,char *pStr,int nTotalPo,int nTotalSize,abctime clkStart)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  abctime clkStart_local;
  int nTotalSize_local;
  int nTotalPo_local;
  char *pStr_local;
  Aig_Man_t *p_local;
  
  printf("%3s : ",pStr);
  uVar1 = Saig_ManPiNum(p);
  printf("PI =%6d  ",(ulong)uVar1);
  uVar1 = Saig_ManPoNum(p);
  printf("PO =%6d  ",(ulong)uVar1);
  uVar1 = Saig_ManRegNum(p);
  printf("FF =%7d  ",(ulong)uVar1);
  uVar1 = Aig_ManNodeNum(p);
  printf("ND =%7d  ",(ulong)uVar1);
  iVar2 = Saig_ManPoNum(p);
  iVar3 = Saig_ManPoNum(p);
  iVar4 = Abc_MaxInt(1,nTotalPo);
  printf("Solved =%7d (%5.1f %%)  ",((double)(nTotalPo - iVar3) * 100.0) / (double)iVar4,
         (ulong)(uint)(nTotalPo - iVar2));
  uVar1 = Aig_ManObjNum(p);
  iVar2 = Aig_ManObjNum(p);
  iVar3 = Abc_MaxInt(1,nTotalSize);
  printf("Size   =%7d (%5.1f %%)  ",((double)iVar2 * 100.0) / (double)iVar3,(ulong)uVar1);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - clkStart);
  return;
}

Assistant:

void Gia_ManMultiReport( Aig_Man_t * p, char * pStr, int nTotalPo, int nTotalSize, abctime clkStart )
{
    printf( "%3s : ", pStr );
    printf( "PI =%6d  ", Saig_ManPiNum(p) );
    printf( "PO =%6d  ", Saig_ManPoNum(p) );
    printf( "FF =%7d  ", Saig_ManRegNum(p) );
    printf( "ND =%7d  ", Aig_ManNodeNum(p) );
    printf( "Solved =%7d (%5.1f %%)  ", nTotalPo-Saig_ManPoNum(p), 100.0*(nTotalPo-Saig_ManPoNum(p))/Abc_MaxInt(1, nTotalPo) );
    printf( "Size   =%7d (%5.1f %%)  ", Aig_ManObjNum(p),          100.0*Aig_ManObjNum(p)/Abc_MaxInt(1, nTotalSize) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
}